

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O3

void __thiscall
TPZFrontNonSym<long_double>::FreeGlobal(TPZFrontNonSym<long_double> *this,int64_t global)

{
  long *plVar1;
  long lVar2;
  
  plVar1 = (this->super_TPZFront<long_double>).fLocal.fStore;
  lVar2 = plVar1[global];
  if (lVar2 != -1) {
    (this->super_TPZFront<long_double>).fGlobal.super_TPZVec<long>.fStore[lVar2] = -1;
    plVar1[global] = -1;
    TPZStack<int,_10>::Push(&(this->super_TPZFront<long_double>).fFree,(int)lVar2);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"TPZFront FreeGlobal was called with wrong parameters !",0x36);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::FreeGlobal(int64_t global)
{
	if(this->fLocal[global]==-1){
		cout << "TPZFront FreeGlobal was called with wrong parameters !" << endl;
		return;
	}
	int64_t index;
	index=this->fLocal[global];
	this->fGlobal[index]=-1;
	this->fLocal[global]=-1;
	this->fFree.Push(index);
}